

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O1

void __thiscall cbor_bytes::cbor_bytes(cbor_bytes *this,cbor_bytes *other)

{
  ulong __n;
  uint8_t *__dest;
  
  __n = other->l;
  this->l = __n;
  if (__n != 0) {
    __dest = (uint8_t *)operator_new__(__n);
    this->v = __dest;
    memcpy(__dest,other->v,__n);
    return;
  }
  this->v = (uint8_t *)0x0;
  return;
}

Assistant:

cbor_bytes::cbor_bytes(const cbor_bytes& other)
{
    l = other.l;
    if (l > 0) {
        v = new uint8_t[l];
        memcpy(v, other.v, l);
    }
    else {
        v = NULL;
    }
}